

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O1

uint32_t ans_msb_exception_bytes(uint32_t x)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if ((0x100 < x) && (uVar1 = 1, 0x200 < x)) {
    uVar1 = 3 - (x < 0x301);
  }
  return uVar1;
}

Assistant:

uint32_t ans_msb_exception_bytes(uint32_t x)
{
    if (x <= 256)
        return 0;
    if (x <= 512)
        return 1;
    if (x <= 768)
        return 2;
    return 3;
}